

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSVN.h
# Opt level: O3

void __thiscall cmCTestSVN::SVNInfo::SVNInfo(SVNInfo *this,char *path)

{
  allocator local_9;
  
  std::__cxx11::string::string((string *)this,path,&local_9);
  (this->URL)._M_dataplus._M_p = (pointer)&(this->URL).field_2;
  (this->URL)._M_string_length = 0;
  (this->URL).field_2._M_local_buf[0] = '\0';
  (this->Root)._M_dataplus._M_p = (pointer)&(this->Root).field_2;
  (this->Root)._M_string_length = 0;
  (this->Root).field_2._M_local_buf[0] = '\0';
  (this->Base)._M_dataplus._M_p = (pointer)&(this->Base).field_2;
  (this->Base)._M_string_length = 0;
  (this->Base).field_2._M_local_buf[0] = '\0';
  (this->OldRevision)._M_dataplus._M_p = (pointer)&(this->OldRevision).field_2;
  (this->OldRevision)._M_string_length = 0;
  (this->OldRevision).field_2._M_local_buf[0] = '\0';
  (this->NewRevision)._M_dataplus._M_p = (pointer)&(this->NewRevision).field_2;
  (this->NewRevision)._M_string_length = 0;
  (this->NewRevision).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

SVNInfo(const char* path) : LocalPath(path) {}